

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ktx::convertUNORM<ImageT<unsigned_short,2u>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,ktx *this,
          unique_ptr<Image,_std::default_delete<Image>_> *image,string_view swizzle)

{
  if (image != (unique_ptr<Image,_std::default_delete<Image>_> *)0x0) {
    (**(code **)(**(long **)this + 0xa8))(*(long **)this,image,swizzle._M_len);
  }
  (**(code **)(**(long **)this + 0x40))(__return_storage_ptr__,*(long **)this,2,0x10,0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> convertUNORM(const std::unique_ptr<Image>& image, std::string_view swizzle = "") {
    using ComponentT = typename T::Color::value_type;
    static constexpr auto componentCount = T::Color::getComponentCount();
    static constexpr auto bytesPerComponent = sizeof(ComponentT);
    static constexpr auto bits = bytesPerComponent * 8;

    if (!swizzle.empty())
        image->swizzle(swizzle);

    return image->getUNORM(componentCount, bits);
}